

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_xar.c
# Opt level: O3

int xar_compression_init_encoder(archive_write *a)

{
  undefined4 uVar1;
  uint uVar2;
  void *pvVar3;
  char cVar4;
  int iVar5;
  void *__ptr;
  char *fmt;
  int iVar6;
  lzma_options_lzma lzma_opt;
  long local_118 [4];
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined1 local_98 [112];
  
  pvVar3 = a->format_data;
  switch(*(undefined4 *)((long)pvVar3 + 0x88)) {
  case 1:
    iVar5 = compression_init_encoder_gzip
                      (&a->archive,(la_zstream *)((long)pvVar3 + 200),*(int *)((long)pvVar3 + 0x8c),
                       0x186090);
    goto LAB_0015f669;
  case 2:
    if (*(int *)((long)pvVar3 + 0xf8) != 0) {
      (**(code **)((long)pvVar3 + 0x110))(a,(long)pvVar3 + 200);
    }
    archive_set_error(&a->archive,-1,"%s compression not supported on this platform","bzip2");
    *(undefined4 *)((long)pvVar3 + 0xf8) = 0;
    *(undefined8 *)((long)pvVar3 + 0x100) = 0;
    return -0x19;
  case 3:
    uVar1 = *(undefined4 *)((long)pvVar3 + 0x8c);
    if (*(int *)((long)pvVar3 + 0xf8) != 0) {
      (**(code **)((long)pvVar3 + 0x110))(a,(long)pvVar3 + 200);
    }
    cVar4 = lzma_lzma_preset(local_118,uVar1);
    if (cVar4 != '\0') goto LAB_0015f4ed;
    __ptr = calloc(1,0x88);
    if (__ptr == (void *)0x0) {
      fmt = "Can\'t allocate memory for lzma stream";
      goto LAB_0015f655;
    }
    iVar5 = lzma_alone_encoder(__ptr,local_118);
LAB_0015f5f7:
    if (iVar5 == 5) {
      free(__ptr);
      *(undefined8 *)((long)pvVar3 + 0x100) = 0;
      fmt = "Internal error initializing compression library: Cannot allocate memory";
      goto LAB_0015f655;
    }
    if (iVar5 == 0) {
      *(void **)((long)pvVar3 + 0x100) = __ptr;
      *(undefined4 *)((long)pvVar3 + 0xf8) = 1;
      *(code **)((long)pvVar3 + 0x108) = compression_code_lzma;
      *(code **)((long)pvVar3 + 0x110) = compression_end_lzma;
      iVar5 = 0;
      goto LAB_0015f669;
    }
    free(__ptr);
    *(undefined8 *)((long)pvVar3 + 0x100) = 0;
    fmt = "Internal error initializing compression library: It\'s a bug in liblzma";
    iVar5 = -1;
    break;
  case 4:
    iVar5 = *(int *)((long)pvVar3 + 0x8c);
    uVar2 = *(uint *)((long)pvVar3 + 0x90);
    if (*(int *)((long)pvVar3 + 0xf8) != 0) {
      (**(code **)((long)pvVar3 + 0x110))(a,(long)pvVar3 + 200);
    }
    __ptr = calloc(1,0xa8);
    if (__ptr == (void *)0x0) {
      fmt = "Can\'t allocate memory for xz stream";
      goto LAB_0015f655;
    }
    iVar6 = 9;
    if (iVar5 < 9) {
      iVar6 = iVar5;
    }
    cVar4 = lzma_lzma_preset(local_98,iVar6);
    if (cVar4 == '\0') {
      *(undefined8 *)((long)__ptr + 0x88) = 0x21;
      *(undefined1 **)((long)__ptr + 0x90) = local_98;
      *(undefined8 *)((long)__ptr + 0x98) = 0xffffffffffffffff;
      if ((int)uVar2 < 2) {
        iVar5 = lzma_stream_encoder(__ptr,(long)__ptr + 0x88,4);
      }
      else {
        local_118[1] = 0;
        uStack_f0 = 0;
        local_a8 = 0;
        uStack_a0 = 0;
        local_b8 = 0;
        uStack_b0 = 0;
        local_c8 = 0;
        uStack_c0 = 0;
        local_d8 = 0;
        uStack_d0 = 0;
        local_e8 = 0;
        uStack_e0 = 0;
        local_118[0] = (ulong)uVar2 << 0x20;
        local_118[2] = 300;
        local_f8 = 4;
        local_118[3] = (long)__ptr + 0x88;
        iVar5 = lzma_stream_encoder_mt(__ptr,local_118);
      }
      goto LAB_0015f5f7;
    }
    free(__ptr);
LAB_0015f4ed:
    *(undefined8 *)((long)pvVar3 + 0x100) = 0;
    fmt = "Internal error initializing compression library";
LAB_0015f655:
    iVar5 = 0xc;
    break;
  default:
    goto switchD_0015f3f5_default;
  }
  archive_set_error(&a->archive,iVar5,fmt);
  iVar5 = -0x1e;
LAB_0015f669:
  if (iVar5 == 0) {
switchD_0015f3f5_default:
    iVar5 = 0;
    *(undefined8 *)((long)pvVar3 + 0xd8) = 0;
    *(long *)((long)pvVar3 + 0xe0) = (long)pvVar3 + 0x120;
    *(undefined8 *)((long)pvVar3 + 0xe8) = 0x10000;
    *(undefined8 *)((long)pvVar3 + 0xf0) = 0;
  }
  return iVar5;
}

Assistant:

static int
xar_compression_init_encoder(struct archive_write *a)
{
	struct xar *xar;
	int r;

	xar = (struct xar *)a->format_data;
	switch (xar->opt_compression) {
	case GZIP:
		r = compression_init_encoder_gzip(
		    &(a->archive), &(xar->stream),
		    xar->opt_compression_level, 1);
		break;
	case BZIP2:
		r = compression_init_encoder_bzip2(
		    &(a->archive), &(xar->stream),
		    xar->opt_compression_level);
		break;
	case LZMA:
		r = compression_init_encoder_lzma(
		    &(a->archive), &(xar->stream),
		    xar->opt_compression_level);
		break;
	case XZ:
		r = compression_init_encoder_xz(
		    &(a->archive), &(xar->stream),
		    xar->opt_compression_level, xar->opt_threads);
		break;
	default:
		r = ARCHIVE_OK;
		break;
	}
	if (r == ARCHIVE_OK) {
		xar->stream.total_in = 0;
		xar->stream.next_out = xar->wbuff;
		xar->stream.avail_out = sizeof(xar->wbuff);
		xar->stream.total_out = 0;
	}

	return (r);
}